

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::simplify(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,Real remainingTime,bool keepbounds,uint32_t seed)

{
  type_conflict5 tVar1;
  bool bVar2;
  SPxSense SVar3;
  int iVar4;
  Verbosity VVar5;
  int iVar6;
  int iVar7;
  Result RVar8;
  ulong *puVar9;
  element_type *peVar10;
  int *piVar11;
  SPxOut *manip;
  SPxOut *_spxout;
  byte in_DL;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long in_RDI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000088;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000090;
  Verbosity old_verbosity_8;
  Verbosity old_verbosity_7;
  int j_2;
  int i_2;
  int numEqualities_1;
  int numBoxedCols_1;
  int numRangedRows_1;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  int j_1;
  int i_1;
  int k;
  int j;
  int i;
  int numEqualities;
  int numBoxedCols;
  int numRangedRows;
  Verbosity old_verbosity;
  int nrounds;
  bool again;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000620;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000628;
  bool *in_stack_00000678;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000680;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000688;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000a20;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000a28;
  bool *in_stack_00000a88;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000a90;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000a98;
  bool *in_stack_00000dc8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000dd0;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000dd8;
  bool *in_stack_00000fa0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000fa8;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000fb0;
  bool *in_stack_000022e8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000022f0;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000022f8;
  bool *in_stack_00002b30;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00002b38;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00002b40;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff868;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff870;
  double in_stack_fffffffffffff878;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff880;
  double in_stack_fffffffffffff8d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff8d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff8e0;
  double in_stack_fffffffffffff8f0;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff8f8;
  type_conflict5 local_6f9;
  type_conflict5 local_6cd;
  type_conflict5 local_619;
  type_conflict5 local_5ed;
  undefined4 local_5e0;
  Verbosity local_5dc [3];
  undefined1 local_5d0 [56];
  ulong local_598;
  undefined1 local_58c [56];
  int local_554;
  undefined1 local_540 [24];
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffad8;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffae0;
  undefined1 local_508 [56];
  undefined1 local_4d0 [56];
  ulong local_498;
  undefined1 local_48c [56];
  int local_454;
  int local_450;
  int local_44c;
  int local_448;
  undefined4 local_444;
  Verbosity local_440 [3];
  undefined4 local_434;
  Verbosity local_430 [3];
  Verbosity local_424;
  Verbosity local_420 [3];
  int local_414;
  int local_410;
  int local_40c;
  undefined1 local_408 [56];
  ulong local_3d0;
  undefined1 local_3c8 [56];
  int local_390;
  undefined1 local_370 [56];
  undefined1 local_338 [56];
  undefined1 local_300 [56];
  ulong local_2c8;
  undefined1 local_2c0 [56];
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  undefined4 local_278;
  Verbosity local_274;
  int local_270;
  byte local_269;
  ulong local_268;
  undefined1 local_260 [56];
  ulong local_228;
  undefined1 local_220 [56];
  undefined8 local_1e8;
  byte local_1d9;
  Result local_1bc;
  undefined8 local_1b8;
  ulong *local_1b0;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  ulong *local_198;
  undefined1 *local_190;
  undefined8 local_188;
  ulong *local_180;
  undefined1 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined1 *local_160;
  undefined8 local_158;
  ulong *local_150;
  undefined1 *local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined1 *local_130;
  undefined8 local_128;
  ulong *local_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined1 *local_100;
  undefined8 local_f8;
  ulong *local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  undefined1 *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  long local_80;
  undefined1 *local_78;
  long local_70;
  undefined8 local_68;
  ulong *local_60;
  undefined8 local_58;
  ulong *local_50;
  undefined8 local_48;
  ulong *local_40;
  undefined8 local_38;
  ulong *local_30;
  ulong *local_28;
  ulong *local_20;
  undefined8 *local_18;
  long local_10;
  undefined8 *local_8;
  
  local_1d9 = in_DL & 1;
  *(SPxOut **)(in_RDI + 0xa8) = in_RSI->spxout;
  SVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::spxSense(in_RSI);
  *(SPxSense *)(in_RDI + 0x218) = SVar3;
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))();
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))();
  local_1e8 = 0;
  local_10 = in_RDI + 0x38;
  local_18 = &local_1e8;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
  puVar9 = (ulong *)infinity();
  local_228 = *puVar9 ^ 0x8000000000000000;
  local_1a8 = local_220;
  local_1b0 = &local_228;
  local_1b8 = 0;
  local_20 = local_1b0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff880,in_stack_fffffffffffff878,
             in_stack_fffffffffffff870);
  local_70 = in_RDI + 0x228;
  local_78 = local_220;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff870,
             (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff868);
  puVar9 = (ulong *)infinity();
  local_268 = *puVar9 ^ 0x8000000000000000;
  local_190 = local_260;
  local_198 = &local_268;
  local_1a0 = 0;
  local_28 = local_198;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff880,in_stack_fffffffffffff878,
             in_stack_fffffffffffff870);
  local_80 = in_RDI + 0x260;
  local_88 = local_260;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff870,
             (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff868);
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 0x30) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)(in_RDI + 0x224) = 0;
  local_269 = 1;
  local_270 = 0;
  iVar4 = Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
          ::size((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                  *)0x3f78f6);
  if (0 < iVar4) {
    Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
    ::clear((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
             *)0x3f790f);
  }
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  ::reSize((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
            *)in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
  *(undefined1 *)(in_RDI + 0x1f8) = 0;
  if ((*(long *)(in_RDI + 0xa8) != 0) &&
     (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8)), 3 < (int)VVar5)) {
    local_274 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8));
    local_278 = 4;
    (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),&local_278);
    local_27c = 0;
    local_280 = 0;
    local_284 = 0;
    for (local_288 = 0; iVar4 = local_288,
        iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x3f79f1), iVar4 < iVar6; local_288 = local_288 + 1) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhs(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      puVar9 = (ulong *)infinity();
      local_2c8 = *puVar9 ^ 0x8000000000000000;
      local_178 = local_2c0;
      local_180 = &local_2c8;
      local_188 = 0;
      local_30 = local_180;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff880,
                 in_stack_fffffffffffff878,in_stack_fffffffffffff870);
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff868,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3f7ab5);
      local_5ed = false;
      if (tVar1) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::rhs(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
        local_168 = infinity();
        local_160 = local_300;
        local_170 = 0;
        local_38 = local_168;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff880,
                   in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        local_5ed = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_fffffffffffff868,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x3f7b51);
      }
      if (local_5ed != false) {
        local_c8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::lhs(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
        local_c0 = local_338;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff870,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff868);
        local_b8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::rhs(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
        local_b0 = local_370;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff870,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff868);
        SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff868);
        peVar10 = std::
                  __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x3f7c14);
        Tolerances::epsilon(peVar10);
        bVar2 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
                           in_stack_fffffffffffff8d0);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3f7c5b)
        ;
        if (bVar2) {
          local_284 = local_284 + 1;
        }
        else {
          local_27c = local_27c + 1;
        }
      }
    }
    for (local_390 = 0; iVar4 = local_390,
        iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x3f7cf2), iVar4 < iVar6; local_390 = local_390 + 1) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lower(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      puVar9 = (ulong *)infinity();
      local_3d0 = *puVar9 ^ 0x8000000000000000;
      local_148 = local_3c8;
      local_150 = &local_3d0;
      local_158 = 0;
      local_40 = local_150;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff880,
                 in_stack_fffffffffffff878,in_stack_fffffffffffff870);
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff868,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3f7db6);
      local_619 = false;
      if (tVar1) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::upper(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
        local_138 = infinity();
        local_130 = local_408;
        local_140 = 0;
        local_48 = local_138;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff880,
                   in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        local_619 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_fffffffffffff868,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x3f7e52);
      }
      if (local_619 != false) {
        local_280 = local_280 + 1;
      }
    }
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                       (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                       (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                       (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff868);
    (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),&local_274);
  }
  DataArray<int>::reSize
            ((DataArray<int> *)in_stack_fffffffffffff870,
             (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
  for (local_40c = 0; iVar4 = local_40c,
      iVar6 = DataArray<int>::size((DataArray<int> *)(in_RDI + 0x200)), iVar4 < iVar6;
      local_40c = local_40c + 1) {
    piVar11 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),local_40c);
    *piVar11 = 0;
  }
  *(undefined4 *)(in_RDI + 0x220) = 0;
  handleRowObjectives(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3f7ffb);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
          SUB81((ulong)in_stack_fffffffffffff8d8 >> 0x18,0));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3f8032);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
          SUB81((ulong)in_stack_fffffffffffff8d8 >> 0x18,0));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3f8069);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
          SUB81((ulong)in_stack_fffffffffffff8d8 >> 0x18,0));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3f80a0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
          SUB81((ulong)in_stack_fffffffffffff8d8 >> 0x18,0));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3f80d7);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::reSize((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
            *)in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3f8109);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::reSize((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
            *)in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3f813b);
  DataArray<int>::reSize
            ((DataArray<int> *)in_stack_fffffffffffff870,
             (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3f816d);
  DataArray<int>::reSize
            ((DataArray<int> *)in_stack_fffffffffffff870,
             (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3f819f);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reSize((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3f81d1);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reSize((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3f8203);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reSize((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3f8235);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reSize((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
  *(byte *)(in_RDI + 0x21c) = local_1d9 & 1;
  for (local_410 = 0; iVar4 = local_410,
      iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3f8282), iVar6 = local_410, iVar4 < iVar7; local_410 = local_410 + 1) {
    piVar11 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x168),local_410);
    *piVar11 = iVar6;
  }
  for (local_414 = 0; iVar4 = local_414,
      iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3f82fa), iVar6 = local_414, iVar4 < iVar7; local_414 = local_414 + 1) {
    piVar11 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x150),local_414);
    *piVar11 = iVar6;
  }
  handleExtremes(in_stack_00000a28,in_stack_00000a20);
  while( true ) {
    bVar2 = false;
    if ((local_269 & 1) != 0) {
      bVar2 = *(int *)(in_RDI + 0x224) == 0;
    }
    if (!bVar2) break;
    local_270 = local_270 + 1;
    if ((*(long *)(in_RDI + 0xa8) != 0) &&
       (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8)), 4 < (int)VVar5)) {
      local_420[2] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8));
      local_420[1] = 5;
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),local_420 + 1);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff868);
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),local_420 + 2);
    }
    local_269 = 0;
    if (*(int *)(in_RDI + 0x224) == 0) {
      RVar8 = simplifyRows(in_stack_00002b40,in_stack_00002b38,in_stack_00002b30);
      *(Result *)(in_RDI + 0x224) = RVar8;
    }
    if (*(int *)(in_RDI + 0x224) == 0) {
      RVar8 = simplifyCols(in_stack_000022f8,in_stack_000022f0,in_stack_000022e8);
      *(Result *)(in_RDI + 0x224) = RVar8;
    }
    if ((local_269 & 1) == 0) {
      if (*(int *)(in_RDI + 0x224) == 0) {
        RVar8 = simplifyDual(in_stack_00000a98,in_stack_00000a90,in_stack_00000a88);
        *(Result *)(in_RDI + 0x224) = RVar8;
      }
      if ((local_269 & 1) == 0) {
        if (*(int *)(in_RDI + 0x224) == 0) {
          RVar8 = duplicateRows(in_stack_00000688,in_stack_00000680,in_stack_00000678);
          *(Result *)(in_RDI + 0x224) = RVar8;
        }
        if (*(int *)(in_RDI + 0x224) == 0) {
          RVar8 = duplicateCols(in_stack_00000fb0,in_stack_00000fa8,in_stack_00000fa0);
          *(Result *)(in_RDI + 0x224) = RVar8;
        }
        if ((local_269 & 1) == 0) {
          trivialHeuristic(in_stack_00000628,in_stack_00000620);
          propagatePseudoobj(in_stack_00000090,in_stack_00000088);
          if (*(int *)(in_RDI + 0x224) == 0) {
            RVar8 = multiaggregation(in_stack_00000dd8,in_stack_00000dd0,in_stack_00000dc8);
            *(Result *)(in_RDI + 0x224) = RVar8;
          }
        }
      }
    }
  }
  if (*(int *)(in_RDI + 0x224) == 0) {
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) - *(int *)(in_RDI + 0x220);
    *(int *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x24) - *(int *)(in_RDI + 0x220);
    if ((*(long *)(in_RDI + 0xa8) != 0) &&
       (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8)), 2 < (int)VVar5)) {
      local_430[2] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8));
      local_430[1] = INFO1;
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),local_430 + 1);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff868);
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),local_430 + 2);
    }
    if ((((local_1d9 & 1) != 0) && (*(long *)(in_RDI + 0xa8) != 0)) &&
       (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8)), 3 < (int)VVar5)) {
      local_430[0] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8));
      local_434 = 4;
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),&local_434);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff868);
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),local_430);
    }
    if ((*(long *)(in_RDI + 0xa8) != 0) &&
       (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8)), 2 < (int)VVar5)) {
      local_440[2] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8));
      local_440[1] = 3;
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),local_440 + 1);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x3f8aca);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x3f8afd);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nNzos(in_stack_fffffffffffff880);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff868);
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),local_440 + 2);
    }
    if ((*(long *)(in_RDI + 0xa8) != 0) &&
       (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8)), 3 < (int)VVar5)) {
      local_440[0] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8));
      local_444 = 4;
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),&local_444);
      local_448 = 0;
      local_44c = 0;
      local_450 = 0;
      for (local_454 = 0; iVar4 = local_454,
          iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x3f8c41), iVar4 < iVar6; local_454 = local_454 + 1) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lhs(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
        puVar9 = (ulong *)infinity();
        local_498 = *puVar9 ^ 0x8000000000000000;
        local_118 = local_48c;
        local_120 = &local_498;
        local_128 = 0;
        local_50 = local_120;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff880,
                   in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        tVar1 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff868,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3f8d05);
        local_6cd = false;
        if (tVar1) {
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rhs(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
          local_108 = infinity();
          local_100 = local_4d0;
          local_110 = 0;
          local_58 = local_108;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff880,
                     in_stack_fffffffffffff878,in_stack_fffffffffffff870);
          local_6cd = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_fffffffffffff868,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x3f8da1);
        }
        if (local_6cd != false) {
          local_a8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::lhs(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20)
                          );
          local_a0 = local_508;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff870,
                     (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff868);
          local_98 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::rhs(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20)
                          );
          local_90 = local_540;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff870,
                     (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff868);
          SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff868);
          peVar10 = std::
                    __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x3f8e64);
          Tolerances::epsilon(peVar10);
          bVar2 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
                             in_stack_fffffffffffff8d0);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x3f8eab);
          if (bVar2) {
            local_450 = local_450 + 1;
          }
          else {
            local_448 = local_448 + 1;
          }
        }
      }
      for (local_554 = 0; iVar4 = local_554,
          iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x3f8f42), iVar4 < iVar6; local_554 = local_554 + 1) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lower(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
        puVar9 = (ulong *)infinity();
        local_598 = *puVar9 ^ 0x8000000000000000;
        local_e8 = local_58c;
        local_f0 = &local_598;
        local_f8 = 0;
        local_60 = local_f0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff880,
                   in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        tVar1 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff868,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3f9006);
        local_6f9 = false;
        if (tVar1) {
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::upper(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
          local_d8 = infinity();
          local_d0 = local_5d0;
          local_e0 = 0;
          local_68 = local_d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff880,
                     in_stack_fffffffffffff878,in_stack_fffffffffffff870);
          local_6f9 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_fffffffffffff868,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x3f90a2);
        }
        if (local_6f9 != false) {
          local_44c = local_44c + 1;
        }
      }
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff868);
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),local_440);
    }
    iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x3f918f);
    if ((iVar4 == 0) &&
       (iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x3f91a5), iVar4 == 0)) {
      if ((*(long *)(in_RDI + 0xa8) != 0) &&
         (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8)), 2 < (int)VVar5)) {
        local_5dc[2] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8));
        local_5dc[1] = 3;
        (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),local_5dc + 1);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                           (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff868);
        (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),local_5dc + 2);
      }
      *(undefined4 *)(in_RDI + 0x224) = 4;
    }
    if ((*(long *)(in_RDI + 0xa8) != 0) &&
       (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8)), 3 < (int)VVar5)) {
      local_5dc[0] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8));
      local_5e0 = 4;
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),&local_5e0);
      manip = soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                                 (char *)in_stack_fffffffffffff868);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),0);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(int)((ulong)manip >> 0x20));
      _spxout = soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),1);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),2);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),3);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),4);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),5);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),6);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),7);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),8);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),9);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),10);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),0xb);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),0xc);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),0xd);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),0xe);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),0xf);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x200),0x10);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)manip);
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),local_5dc);
    }
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x20))();
    local_1bc = *(Result *)(in_RDI + 0x224);
  }
  else {
    if ((*(long *)(in_RDI + 0xa8) != 0) &&
       (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8)), 2 < (int)VVar5)) {
      local_420[0] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xa8));
      local_424 = 3;
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),&local_424);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff870,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff868);
      (**(code **)(**(long **)(in_RDI + 0xa8) + 0x10))(*(long **)(in_RDI + 0xa8),local_420);
    }
    local_1bc = *(Result *)(in_RDI + 0x224);
  }
  return local_1bc;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::simplify(SPxLPBase<R>& lp, Real remainingTime,
      bool keepbounds, uint32_t seed)
{
   // transfer message handler
   this->spxout = lp.spxout;
   assert(this->spxout != nullptr);

   m_thesense = lp.spxSense();
   this->m_timeUsed->reset();
   this->m_timeUsed->start();

   this->m_objoffset = 0.0;
   m_cutoffbound = R(-infinity);
   m_pseudoobj = R(-infinity);

   this->m_remRows = 0;
   this->m_remCols = 0;
   this->m_remNzos = 0;
   this->m_chgBnds = 0;
   this->m_chgLRhs = 0;
   this->m_keptBnds = 0;
   this->m_keptLRhs = 0;

   m_result     = this->OKAY;
   bool   again = true;
   int nrounds = 0;

   if(m_hist.size() > 0)
   {
      m_hist.clear();
   }

   m_hist.reSize(0);
   m_postsolved = false;

   SPX_MSG_INFO2((*this->spxout),
                 int numRangedRows = 0;
                 int numBoxedCols = 0;
                 int numEqualities = 0;

                 for(int i = 0; i < lp.nRows(); ++i)
{
   if(lp.lhs(i) > R(-infinity) && lp.rhs(i) < R(infinity))
      {
         if(EQ(lp.lhs(i), lp.rhs(i), this->tolerances()->epsilon()))
            ++numEqualities;
         else
            ++numRangedRows;
      }
   }
   for(int j = 0; j < lp.nCols(); ++j)
   if(lp.lower(j) > R(-infinity) && lp.upper(j) < R(infinity))
      ++numBoxedCols;

      (*this->spxout) << "LP has "
                      << numEqualities << " equations, "
                      << numRangedRows << " ranged rows, "
                      << numBoxedCols << " boxed columns"
                      << std::endl;
                   )

         m_stat.reSize(17);

   for(int k = 0; k < m_stat.size(); ++k)
      m_stat[k] = 0;

   m_addedcols = 0;
   handleRowObjectives(lp);

   m_prim.reDim(lp.nCols());
   m_slack.reDim(lp.nRows());
   m_dual.reDim(lp.nRows());
   m_redCost.reDim(lp.nCols());
   m_cBasisStat.reSize(lp.nCols());
   m_rBasisStat.reSize(lp.nRows());
   m_cIdx.reSize(lp.nCols());
   m_rIdx.reSize(lp.nRows());

   m_classSetRows.reSize(lp.nRows());
   m_classSetCols.reSize(lp.nCols());
   m_dupRows.reSize(lp.nRows());
   m_dupCols.reSize(lp.nCols());

   m_keepbounds = keepbounds;

   for(int i = 0; i < lp.nRows(); ++i)
      m_rIdx[i] = i;

   for(int j = 0; j < lp.nCols(); ++j)
      m_cIdx[j] = j;

   // round extreme values (set all values smaller than this->eps to zero and all values bigger than R(infinity)/5 to R(infinity))
#if SOPLEX_EXTREMES
   handleExtremes(lp);
#endif

   // main presolving loop
   while(again && m_result == this->OKAY)
   {
      nrounds++;
      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Round " << nrounds << ":" << std::endl;)
      again = false;

#if SOPLEX_ROWS_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyRows(lp, again);

#endif

#if SOPLEX_COLS_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyCols(lp, again);

#endif

      if(again)
         continue;

#if SOPLEX_DUAL_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyDual(lp, again);

#endif

      if(again)
         continue;

#if SOPLEX_DUPLICATE_ROWS

      if(m_result == this->OKAY)
         m_result = duplicateRows(lp, again);

#endif

#if SOPLEX_DUPLICATE_COLS

      if(m_result == this->OKAY)
         m_result = duplicateCols(lp, again);

#endif

      if(!again)
      {
#if SOPLEX_TRIVIAL_HEURISTICS
         trivialHeuristic(lp);
#endif

#if SOPLEX_PSEUDOOBJ
         propagatePseudoobj(lp);
#endif

#if SOPLEX_MULTI_AGGREGATE

         if(m_result == this->OKAY)
            m_result = multiaggregation(lp, again);

#endif
      }

   }

   // preprocessing detected infeasibility or unboundedness
   if(m_result != this->OKAY)
   {
      SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier result: " << static_cast<int>
                    (m_result) << std::endl;)
      return m_result;
   }

   this->m_remCols -= m_addedcols;
   this->m_remNzos -= m_addedcols;
   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier removed "
                 << this->m_remRows << " rows, "
                 << this->m_remCols << " columns, "
                 << this->m_remNzos << " nonzeros, "
                 << this->m_chgBnds << " col bounds, "
                 << this->m_chgLRhs << " row bounds"
                 << std::endl;)

   if(keepbounds)
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier kept "
                    << this->m_keptBnds << " column bounds, "
                    << this->m_keptLRhs << " row bounds"
                    << std::endl;)

      SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Reduced LP has "
                    << lp.nRows() << " rows "
                    << lp.nCols() << " columns "
                    << lp.nNzos() << " nonzeros"
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout),
                    int numRangedRows = 0;
                    int numBoxedCols  = 0;
                    int numEqualities = 0;

                    for(int i = 0; i < lp.nRows(); ++i)
   {
      if(lp.lhs(i) > R(-infinity) && lp.rhs(i) < R(infinity))
         {
            if(EQ(lp.lhs(i), lp.rhs(i), this->tolerances()->epsilon()))
               ++numEqualities;
            else
               ++numRangedRows;
         }
      }
   for(int j = 0; j < lp.nCols(); ++j)
   if(lp.lower(j) > R(-infinity) && lp.upper(j) < R(infinity))
      ++numBoxedCols;

      (*this->spxout) << "Reduced LP has "
                      << numEqualities << " equations, "
                      << numRangedRows << " ranged rows, "
                      << numBoxedCols << " boxed columns"
                      << std::endl;
                   )

         if(lp.nCols() == 0 && lp.nRows() == 0)
         {
            SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier removed all rows and columns" <<
                          std::endl;)
            m_result = this->VANISHED;
         }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "\nSimplifier performed:\n"
                 << m_stat[EMPTY_ROW]            << " empty rows\n"
                 << m_stat[FREE_ROW]             << " free rows\n"
                 << m_stat[SINGLETON_ROW]        << " singleton rows\n"
                 << m_stat[FORCE_ROW]            << " forcing rows\n"
                 << m_stat[EMPTY_COL]            << " empty columns\n"
                 << m_stat[FIX_COL]              << " fixed columns\n"
                 << m_stat[FREE_ZOBJ_COL]        << " free columns with zero objective\n"
                 << m_stat[ZOBJ_SINGLETON_COL]   << " singleton columns with zero objective\n"
                 << m_stat[DOUBLETON_ROW]        << " singleton columns combined with a doubleton equation\n"
                 << m_stat[FREE_SINGLETON_COL]   << " free singleton columns\n"
                 << m_stat[DOMINATED_COL]        << " dominated columns\n"
                 << m_stat[WEAKLY_DOMINATED_COL] << " weakly dominated columns\n"
                 << m_stat[DUPLICATE_ROW]        << " duplicate rows\n"
                 << m_stat[FIX_DUPLICATE_COL]    << " duplicate columns (fixed)\n"
                 << m_stat[SUB_DUPLICATE_COL]    << " duplicate columns (substituted)\n"
                 << m_stat[AGGREGATION]          << " variable aggregations\n"
                 << m_stat[MULTI_AGG]            << " multi aggregations\n"
                 << std::endl;);

   this->m_timeUsed->stop();

   return m_result;
}